

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodebuild_extract.cpp
# Opt level: O0

int __thiscall
FNodeBuilder::CloseSubsector
          (FNodeBuilder *this,TArray<FNodeBuilder::glseg_t,_FNodeBuilder::glseg_t> *segs,
          int subsector,vertex_t *outVerts)

{
  int iVar1;
  seg_t *psVar2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  DWORD DVar8;
  angle_t aVar9;
  uint uVar10;
  int iVar11;
  subsector_t *psVar12;
  USegPtr *pUVar13;
  FPrivSeg *pFVar14;
  FPrivVert *pFVar15;
  angle_t diff;
  angle_t ang;
  DWORD bestj;
  FPrivSeg *bestseg;
  angle_t bestdiff;
  int firstplane;
  uint uStack_6c;
  bool diffplanes;
  DWORD j;
  DWORD i;
  DWORD count;
  DWORD max;
  DWORD first;
  int firstVert;
  fixed_t midy;
  fixed_t midx;
  double accumy;
  double accumx;
  FPrivSeg *pFStack_38;
  angle_t prevAngle;
  FPrivSeg *prev;
  FPrivSeg *seg;
  vertex_t *outVerts_local;
  TArray<FNodeBuilder::glseg_t,_FNodeBuilder::glseg_t> *pTStack_18;
  int subsector_local;
  TArray<FNodeBuilder::glseg_t,_FNodeBuilder::glseg_t> *segs_local;
  FNodeBuilder *this_local;
  
  seg = (FPrivSeg *)outVerts;
  outVerts_local._4_4_ = subsector;
  pTStack_18 = segs;
  segs_local = (TArray<FNodeBuilder::glseg_t,_FNodeBuilder::glseg_t> *)this;
  psVar12 = TArray<subsector_t,_subsector_t>::operator[](&this->Subsectors,(long)subsector);
  psVar2 = psVar12->firstline;
  uVar4 = (uint)psVar2;
  psVar12 = TArray<subsector_t,_subsector_t>::operator[]
                      (&this->Subsectors,(long)outVerts_local._4_4_);
  uVar5 = uVar4 + psVar12->numlines;
  _midy = 0.0;
  accumy = 0.0;
  bVar3 = false;
  pUVar13 = TArray<FNodeBuilder::USegPtr,_FNodeBuilder::USegPtr>::operator[]
                      (&this->SegList,(ulong)psVar2 & 0xffffffff);
  pFVar14 = TArray<FNodeBuilder::FPrivSeg,_FNodeBuilder::FPrivSeg>::operator[]
                      (&this->Segs,(ulong)pUVar13->SegNum);
  iVar1 = pFVar14->planenum;
  for (uStack_6c = uVar4; uStack_6c < uVar5; uStack_6c = uStack_6c + 1) {
    pUVar13 = TArray<FNodeBuilder::USegPtr,_FNodeBuilder::USegPtr>::operator[]
                        (&this->SegList,(ulong)uStack_6c);
    prev = TArray<FNodeBuilder::FPrivSeg,_FNodeBuilder::FPrivSeg>::operator[]
                     (&this->Segs,(ulong)pUVar13->SegNum);
    pFVar15 = TArray<FNodeBuilder::FPrivVert,_FNodeBuilder::FPrivVert>::operator[]
                        (&this->Vertices,(long)prev->v1);
    iVar6 = (pFVar15->super_FSimpleVert).x;
    pFVar15 = TArray<FNodeBuilder::FPrivVert,_FNodeBuilder::FPrivVert>::operator[]
                        (&this->Vertices,(long)prev->v2);
    accumy = (double)iVar6 + (double)(pFVar15->super_FSimpleVert).x + accumy;
    pFVar15 = TArray<FNodeBuilder::FPrivVert,_FNodeBuilder::FPrivVert>::operator[]
                        (&this->Vertices,(long)prev->v1);
    iVar6 = (pFVar15->super_FSimpleVert).y;
    pFVar15 = TArray<FNodeBuilder::FPrivVert,_FNodeBuilder::FPrivVert>::operator[]
                        (&this->Vertices,(long)prev->v2);
    _midy = (double)iVar6 + (double)(pFVar15->super_FSimpleVert).y + _midy;
    if (iVar1 != prev->planenum) {
      bVar3 = true;
    }
  }
  iVar6 = (int)((accumy / (double)(uVar5 - uVar4)) * 0.5);
  iVar7 = (int)((_midy / (double)(uVar5 - uVar4)) / 2.0);
  pUVar13 = TArray<FNodeBuilder::USegPtr,_FNodeBuilder::USegPtr>::operator[]
                      (&this->SegList,(ulong)psVar2 & 0xffffffff);
  prev = TArray<FNodeBuilder::FPrivSeg,_FNodeBuilder::FPrivSeg>::operator[]
                   (&this->Segs,(ulong)pUVar13->SegNum);
  pFVar15 = TArray<FNodeBuilder::FPrivVert,_FNodeBuilder::FPrivVert>::operator[]
                      (&this->Vertices,(long)prev->v1);
  iVar1 = (pFVar15->super_FSimpleVert).x;
  pFVar15 = TArray<FNodeBuilder::FPrivVert,_FNodeBuilder::FPrivVert>::operator[]
                      (&this->Vertices,(long)prev->v1);
  accumx._4_4_ = PointToAngle(iVar1 - iVar6,(pFVar15->super_FSimpleVert).y - iVar7);
  DVar8 = PushGLSeg(this,pTStack_18,prev,(vertex_t *)seg);
  prev->storedseg = DVar8;
  j = 1;
  pFStack_38 = prev;
  iVar1 = prev->v1;
  uStack_6c = uVar4;
  if (bVar3) {
    do {
      uStack_6c = uStack_6c + 1;
      pFStack_38 = prev;
      if (uVar5 <= uStack_6c) break;
      bestseg._4_4_ = 0xffffffff;
      _ang = (FPrivSeg *)0x0;
      firstplane = uVar4;
      do {
        pUVar13 = TArray<FNodeBuilder::USegPtr,_FNodeBuilder::USegPtr>::operator[]
                            (&this->SegList,(ulong)(uint)firstplane);
        prev = TArray<FNodeBuilder::FPrivSeg,_FNodeBuilder::FPrivSeg>::operator[]
                         (&this->Segs,(ulong)pUVar13->SegNum);
        pFVar15 = TArray<FNodeBuilder::FPrivVert,_FNodeBuilder::FPrivVert>::operator[]
                            (&this->Vertices,(long)prev->v1);
        iVar11 = (pFVar15->super_FSimpleVert).x;
        pFVar15 = TArray<FNodeBuilder::FPrivVert,_FNodeBuilder::FPrivVert>::operator[]
                            (&this->Vertices,(long)prev->v1);
        aVar9 = PointToAngle(iVar11 - iVar6,(pFVar15->super_FSimpleVert).y - iVar7);
        uVar10 = accumx._4_4_ - aVar9;
        if (prev->v1 == pFStack_38->v2) {
          _ang = prev;
          bestseg._4_4_ = uVar10;
          break;
        }
        if ((uVar10 < bestseg._4_4_) && (uVar10 != 0)) {
          _ang = prev;
          bestseg._4_4_ = uVar10;
        }
        firstplane = firstplane + 1;
      } while ((uint)firstplane < uVar5);
      if (_ang != (FPrivSeg *)0x0) {
        prev = _ang;
      }
      if (pFStack_38->v2 != prev->v1) {
        PushConnectingGLSeg(this,outVerts_local._4_4_,pTStack_18,
                            (vertex_t *)(&seg->v1 + (long)pFStack_38->v2 * 0xe),
                            (vertex_t *)(&seg->v1 + (long)prev->v1 * 0xe));
        j = j + 1;
      }
      accumx._4_4_ = accumx._4_4_ - bestseg._4_4_;
      DVar8 = PushGLSeg(this,pTStack_18,prev,(vertex_t *)seg);
      prev->storedseg = DVar8;
      j = j + 1;
      pFStack_38 = prev;
    } while (prev->v2 != iVar1);
  }
  else {
    iVar6 = OutputDegenerateSubsector
                      (this,pTStack_18,outVerts_local._4_4_,true,0.0,&stack0xffffffffffffffc8,
                       (vertex_t *)seg);
    iVar7 = OutputDegenerateSubsector
                      (this,pTStack_18,outVerts_local._4_4_,false,1.79769313486232e+308,
                       &stack0xffffffffffffffc8,(vertex_t *)seg);
    iVar11 = OutputDegenerateSubsector
                       (this,pTStack_18,outVerts_local._4_4_,true,-1.79769313486232e+308,
                        &stack0xffffffffffffffc8,(vertex_t *)seg);
    j = iVar11 + iVar7 + iVar6 + 1;
  }
  if (pFStack_38->v2 != iVar1) {
    PushConnectingGLSeg(this,outVerts_local._4_4_,pTStack_18,
                        (vertex_t *)(&seg->v1 + (long)pFStack_38->v2 * 0xe),
                        (vertex_t *)(&seg->v1 + (long)iVar1 * 0xe));
    j = j + 1;
  }
  return j;
}

Assistant:

int FNodeBuilder::CloseSubsector (TArray<glseg_t> &segs, int subsector, vertex_t *outVerts)
{
	FPrivSeg *seg, *prev;
	angle_t prevAngle;
	double accumx, accumy;
	fixed_t midx, midy;
	int firstVert;
	DWORD first, max, count, i, j;
	bool diffplanes;
	int firstplane;

	first = (DWORD)(size_t)Subsectors[subsector].firstline;
	max = first + Subsectors[subsector].numlines;
	count = 0;

	accumx = accumy = 0.0;
	diffplanes = false;
	firstplane = Segs[SegList[first].SegNum].planenum;

	// Calculate the midpoint of the subsector and also check for degenerate subsectors.
	// A subsector is degenerate if it exists in only one dimension, which can be
	// detected when all the segs lie in the same plane. This can happen if you have
	// outward-facing lines in the void that don't point toward any sector. (Some of the
	// polyobjects in Hexen are constructed like this.)
	for (i = first; i < max; ++i)
	{
		seg = &Segs[SegList[i].SegNum];
		accumx += double(Vertices[seg->v1].x) + double(Vertices[seg->v2].x);
		accumy += double(Vertices[seg->v1].y) + double(Vertices[seg->v2].y);
		if (firstplane != seg->planenum)
		{
			diffplanes = true;
		}
	}

	midx = fixed_t(accumx / (max - first) / 2);
	midy = fixed_t(accumy / (max - first) / 2);

	seg = &Segs[SegList[first].SegNum];
	prevAngle = PointToAngle (Vertices[seg->v1].x - midx, Vertices[seg->v1].y - midy);
	seg->storedseg = PushGLSeg (segs, seg, outVerts);
	count = 1;
	prev = seg;
	firstVert = seg->v1;

#ifdef DD
	Printf(PRINT_LOG, "--%d--\n", subsector);
	for (j = first; j < max; ++j)
	{
		seg = &Segs[SegList[j].SegNum];
		angle_t ang = PointToAngle (Vertices[seg->v1].x - midx, Vertices[seg->v1].y - midy);
		Printf(PRINT_LOG, "%d%c %5d(%5d,%5d)->%5d(%5d,%5d) - %3.5f  %d,%d  [%08x,%08x]-[%08x,%08x]\n", j,
			seg->linedef == -1 ? '+' : ':',
			seg->v1, Vertices[seg->v1].x>>16, Vertices[seg->v1].y>>16,
			seg->v2, Vertices[seg->v2].x>>16, Vertices[seg->v2].y>>16,
			double(ang/2)*180/(1<<30),
			seg->planenum, seg->planefront,
			Vertices[seg->v1].x, Vertices[seg->v1].y,
			Vertices[seg->v2].x, Vertices[seg->v2].y);
	}
#endif

	if (diffplanes)
	{ // A well-behaved subsector. Output the segs sorted by the angle formed by connecting
	  // the subsector's center to their first vertex.

		D(Printf(PRINT_LOG, "Well behaved subsector\n"));
		for (i = first + 1; i < max; ++i)
		{
			angle_t bestdiff = ANGLE_MAX;
			FPrivSeg *bestseg = NULL;
			DWORD bestj = DWORD_MAX;
			j = first;
			do
			{
				seg = &Segs[SegList[j].SegNum];
				angle_t ang = PointToAngle (Vertices[seg->v1].x - midx, Vertices[seg->v1].y - midy);
				angle_t diff = prevAngle - ang;
				if (seg->v1 == prev->v2)
				{
					bestdiff = diff;
					bestseg = seg;
					bestj = j;
					break;
				}
				if (diff < bestdiff && diff > 0)
				{
					bestdiff = diff;
					bestseg = seg;
					bestj = j;
				}
			}
			while (++j < max);
			// Is a NULL bestseg actually okay?
			if (bestseg != NULL)
			{
				seg = bestseg;
			}
			if (prev->v2 != seg->v1)
			{
				// Add a new miniseg to connect the two segs
				PushConnectingGLSeg (subsector, segs, &outVerts[prev->v2], &outVerts[seg->v1]);
				count++;
			}
#ifdef DD
			Printf(PRINT_LOG, "+%d\n", bestj);
#endif
			prevAngle -= bestdiff;
			seg->storedseg = PushGLSeg (segs, seg, outVerts);
			count++;
			prev = seg;
			if (seg->v2 == firstVert)
			{
				prev = seg;
				break;
			}
		}
#ifdef DD
		Printf(PRINT_LOG, "\n");
#endif
	}
	else
	{ // A degenerate subsector. These are handled in three stages:
	  // Stage 1. Proceed in the same direction as the start seg until we
	  //          hit the seg furthest from it.
	  // Stage 2. Reverse direction and proceed until we hit the seg
	  //          furthest from the start seg.
	  // Stage 3. Reverse direction again and insert segs until we get
	  //          to the start seg.
	  // A dot product serves to determine distance from the start seg.

		D(Printf(PRINT_LOG, "degenerate subsector\n"));

		// Stage 1. Go forward.
		count += OutputDegenerateSubsector (segs, subsector, true, 0, prev, outVerts);

		// Stage 2. Go backward.
		count += OutputDegenerateSubsector (segs, subsector, false, DBL_MAX, prev, outVerts);

		// Stage 3. Go forward again.
		count += OutputDegenerateSubsector (segs, subsector, true, -DBL_MAX, prev, outVerts);
	}

	if (prev->v2 != firstVert)
	{
		PushConnectingGLSeg (subsector, segs, &outVerts[prev->v2], &outVerts[firstVert]);
		count++;
	}
#ifdef DD
	Printf(PRINT_LOG, "Output GL subsector %d:\n", subsector);
	for (i = segs.Size() - count; i < (int)segs.Size(); ++i)
	{
		Printf(PRINT_LOG, "  Seg %5d%c(%5d,%5d)-(%5d,%5d)  [%08x,%08x]-[%08x,%08x]\n", i,
			segs[i].linedef == NULL ? '+' : ' ',
			segs[i].v1->fixX()>>16,
			segs[i].v1->fixY()>>16,
			segs[i].v2->fixX()>>16,
			segs[i].v2->fixY()>>16,
			segs[i].v1->fixX(),
			segs[i].v1->fixY(),
			segs[i].v2->fixX(),
			segs[i].v2->fixY());
	}
#endif

	return count;
}